

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void sect_AbsLongGroup(uint8_t *s,size_t length)

{
  bool bVar1;
  size_t sVar2;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    bVar1 = reserveSpace((int)length * 4);
    if (bVar1) {
      for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
        writelong((uint)s[sVar2]);
      }
    }
  }
  return;
}

Assistant:

void sect_AbsLongGroup(uint8_t const *s, size_t length)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(length * 4))
		return;

	while (length--)
		writelong(*s++);
}